

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O1

Iterator __thiscall List<String>::insert(List<String> *this,Iterator *position,String *value)

{
  Item *pIVar1;
  Item *pIVar2;
  ulong uVar3;
  ItemBlock *pIVar4;
  ulong uVar5;
  long lVar6;
  Iterator *pIVar7;
  long lVar8;
  Item *this_00;
  
  this_00 = this->freeItem;
  if (this_00 == (Item *)0x0) {
    pIVar4 = (ItemBlock *)operator_new__(0xe8);
    pIVar4->next = this->blocks;
    this->blocks = pIVar4;
    lVar6 = 8;
    lVar8 = 0;
    uVar3 = 0xffffffffffffffd0;
    do {
      uVar5 = uVar3;
      *(long *)((long)&pIVar4[0xc].next + uVar5) = lVar8;
      lVar8 = (long)&pIVar4->next + lVar6;
      lVar6 = lVar6 + 0x38;
      uVar3 = uVar5 + 0x38;
    } while (uVar5 + 0x38 < 0xb0);
    this_00 = (Item *)((long)&pIVar4[7].next + uVar5);
    this->freeItem = this_00;
  }
  String::String(&this_00->value,value);
  this->freeItem = this_00->prev;
  pIVar1 = position->item;
  pIVar2 = pIVar1->prev;
  this_00->prev = pIVar2;
  if (pIVar2 == (Item *)0x0) {
    pIVar7 = &this->_begin;
  }
  else {
    pIVar7 = (Iterator *)&pIVar1->prev->next;
  }
  pIVar7->item = this_00;
  this_00->next = pIVar1;
  pIVar1->prev = this_00;
  this->_size = this->_size + 1;
  return (Iterator)this_00;
}

Assistant:

Iterator insert(const Iterator& position, const T& value)
  {
    Item* item = freeItem;
    if(!item)
    {
      ItemBlock* itemBlock = (ItemBlock*)new char[sizeof(ItemBlock) + sizeof(Item) * 4];
      itemBlock->next = blocks;
      blocks = itemBlock;
      for(Item* i = (Item*)(itemBlock + 1), * end = i + 4; i < end; ++i)
      {
        i->prev = item;
        item = i;
      }
      freeItem = item;
    }

    new(item) Item(value);
    freeItem = item->prev;

    Item* insertPos = position.item;
    if((item->prev = insertPos->prev))
      insertPos->prev->next = item;
    else
      _begin.item = item;

    item->next = insertPos;
    insertPos->prev = item;
    ++_size;
    return item;
  }